

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_string_equal_real_literal(void)

{
  undefined1 local_659;
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_61b [2];
  undefined1 local_619;
  basic_variable<std::allocator<char>_> local_618;
  undefined1 local_5db [2];
  undefined1 local_5d9;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_59b [2];
  undefined1 local_599;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55b [2];
  undefined1 local_559;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_51b [2];
  undefined1 local_519;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45a [2];
  undefined1 auStack_458 [8];
  longdouble big_2;
  longdouble zero_2;
  undefined1 local_429;
  basic_variable<std::allocator<char>_> local_428;
  undefined1 local_3eb [2];
  undefined1 local_3e9;
  basic_variable<std::allocator<char>_> local_3e8;
  undefined1 local_3ab [2];
  undefined1 local_3a9;
  basic_variable<std::allocator<char>_> local_3a8;
  undefined1 local_36b [2];
  undefined1 local_369;
  basic_variable<std::allocator<char>_> local_368;
  undefined1 local_32b [2];
  undefined1 local_329;
  basic_variable<std::allocator<char>_> local_328;
  undefined1 local_2eb [2];
  undefined1 local_2e9;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 local_26b [2];
  undefined1 local_269;
  basic_variable<std::allocator<char>_> local_268;
  undefined1 local_232 [2];
  double local_230;
  double big_1;
  double zero_1;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  float local_c;
  float big;
  float zero;
  
  local_c = 0.0;
  local_10 = std::numeric_limits<float>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,"");
  local_12[0] = trial::dynamic::operator==(&local_48,&local_c);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7ac,"void equality_suite::compare_string_equal_real_literal()",local_12,&local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,"");
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_c);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7ad,"void equality_suite::compare_string_equal_real_literal()",local_5e,&local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"");
  local_9b[0] = trial::dynamic::operator==(&local_d8,&local_10);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7ae,"void equality_suite::compare_string_equal_real_literal()",local_9b,&local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,"");
  local_db[0] = trial::dynamic::operator!=(&local_118,&local_10);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7af,"void equality_suite::compare_string_equal_real_literal()",local_db,&local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,"alpha");
  local_11b[0] = trial::dynamic::operator==(&local_158,&local_c);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7b1,"void equality_suite::compare_string_equal_real_literal()",local_11b,&local_159)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,"alpha");
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_c);
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7b2,"void equality_suite::compare_string_equal_real_literal()",local_15b,&local_199)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,"alpha");
  local_19b[0] = trial::dynamic::operator==(&local_1d8,&local_10);
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7b3,"void equality_suite::compare_string_equal_real_literal()",local_19b,&local_1d9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,"alpha");
  local_1db[0] = trial::dynamic::operator!=(&local_218,&local_10);
  zero_1._7_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7b4,"void equality_suite::compare_string_equal_real_literal()",local_1db,
             (long)&zero_1 + 7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  big_1 = 0.0;
  local_230 = std::numeric_limits<double>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_268,"");
  local_232[0] = trial::dynamic::operator==(&local_268,&big_1);
  local_269 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7bb,"void equality_suite::compare_string_equal_real_literal()",local_232,&local_269)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2a8,"");
  local_26b[0] = trial::dynamic::operator!=(&local_2a8,&big_1);
  local_2a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7bc,"void equality_suite::compare_string_equal_real_literal()",local_26b,&local_2a9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,"");
  local_2ab[0] = trial::dynamic::operator==(&local_2e8,&local_230);
  local_2e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7bd,"void equality_suite::compare_string_equal_real_literal()",local_2ab,&local_2e9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_328,"");
  local_2eb[0] = trial::dynamic::operator!=(&local_328,&local_230);
  local_329 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7be,"void equality_suite::compare_string_equal_real_literal()",local_2eb,&local_329)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_368,"alpha");
  local_32b[0] = trial::dynamic::operator==(&local_368,&big_1);
  local_369 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7c0,"void equality_suite::compare_string_equal_real_literal()",local_32b,&local_369)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3a8,"alpha");
  local_36b[0] = trial::dynamic::operator!=(&local_3a8,&big_1);
  local_3a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7c1,"void equality_suite::compare_string_equal_real_literal()",local_36b,&local_3a9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3e8,"alpha");
  local_3ab[0] = trial::dynamic::operator==(&local_3e8,&local_230);
  local_3e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7c2,"void equality_suite::compare_string_equal_real_literal()",local_3ab,&local_3e9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_428,"alpha");
  local_3eb[0] = trial::dynamic::operator!=(&local_428,&local_230);
  local_429 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7c3,"void equality_suite::compare_string_equal_real_literal()",local_3eb,&local_429)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_428);
  unique0x00076c00 = (longdouble)0;
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_498,"");
  local_45a[0] = trial::dynamic::operator==(&local_498,(longdouble *)((long)&big_2 + 8));
  local_499 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7ca,"void equality_suite::compare_string_equal_real_literal()",local_45a,&local_499)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4d8,"");
  local_49b[0] = trial::dynamic::operator!=(&local_4d8,(longdouble *)((long)&big_2 + 8));
  local_4d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7cb,"void equality_suite::compare_string_equal_real_literal()",local_49b,&local_4d9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,"");
  local_4db[0] = trial::dynamic::operator==(&local_518,(longdouble *)auStack_458);
  local_519 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7cc,"void equality_suite::compare_string_equal_real_literal()",local_4db,&local_519)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_558,"");
  local_51b[0] = trial::dynamic::operator!=(&local_558,(longdouble *)auStack_458);
  local_559 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7cd,"void equality_suite::compare_string_equal_real_literal()",local_51b,&local_559)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_598,"alpha");
  local_55b[0] = trial::dynamic::operator==(&local_598,(longdouble *)((long)&big_2 + 8));
  local_599 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,1999,"void equality_suite::compare_string_equal_real_literal()",local_55b,&local_599);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5d8,"alpha");
  local_59b[0] = trial::dynamic::operator!=(&local_5d8,(longdouble *)((long)&big_2 + 8));
  local_5d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,2000,"void equality_suite::compare_string_equal_real_literal()",local_59b,&local_5d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_618,"alpha");
  local_5db[0] = trial::dynamic::operator==(&local_618,(longdouble *)auStack_458);
  local_619 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7d1,"void equality_suite::compare_string_equal_real_literal()",local_5db,&local_619)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_658,"alpha");
  local_61b[0] = trial::dynamic::operator!=(&local_658,(longdouble *)auStack_458);
  local_659 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x7d2,"void equality_suite::compare_string_equal_real_literal()",local_61b,&local_659)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  return;
}

Assistant:

void compare_string_equal_real_literal()
{
    // string - float
    {
        const auto zero = 0.0f;
        const auto big = std::numeric_limits<float>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable("") == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") != big, true);
    }
    // string - double
    {
        const auto zero = 0.0;
        const auto big = std::numeric_limits<double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable("") == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") != big, true);
    }
    // string - long double
    {
        const auto zero = 0.0L;
        const auto big = std::numeric_limits<long double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable("") == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("") != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") != big, true);
    }
}